

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O2

void __thiscall bdNode::genNewTransId(bdNode *this,bdToken *token)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  string num;
  
  num._M_dataplus._M_p = (pointer)&num.field_2;
  num._M_string_length = 0;
  num.field_2._M_local_buf[0] = '\0';
  transIdCounter = transIdCounter + 1;
  uVar3 = 0;
  bd_sprintf(&num,"%02lx");
  uVar1 = 0x14;
  if ((int)(uint)num._M_string_length < 0x14) {
    uVar1 = (uint)num._M_string_length;
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    token->data[uVar3] = num._M_dataplus._M_p[uVar3];
  }
  token->len = uVar1;
  std::__cxx11::string::~string((string *)&num);
  return;
}

Assistant:

void bdNode::genNewTransId(bdToken *token) {
	/* generate message, send to udp */
#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdNode::genNewTransId()");
	fprintf(stderr, ")\n");
#endif
	std::string num;
	bd_sprintf(num, "%02lx", transIdCounter++);
	int len = num.size();
	if (len > BITDHT_TOKEN_MAX_LEN)
		len = BITDHT_TOKEN_MAX_LEN;

	for (int i = 0; i < len; i++)
		token->data[i] = num[i];
	token->len = len;
}